

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O3

void __thiscall embree::SetMB::deterministic_order(SetMB *this)

{
  PrimRefMB *pPVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long lVar4;
  ulong uVar5;
  PrimRefMB *pPVar6;
  
  uVar2 = (this->super_PrimInfoMB).object_range._begin;
  uVar3 = (this->super_PrimInfoMB).object_range._end;
  if (uVar2 == uVar3) {
    return;
  }
  pPVar6 = this->prims->items;
  pPVar1 = pPVar6 + uVar3;
  pPVar6 = pPVar6 + uVar2;
  uVar5 = ((long)(uVar3 * 0x50 + uVar2 * -0x50) >> 4) * -0x3333333333333333;
  lVar4 = 0x3f;
  if (uVar5 != 0) {
    for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  std::__introsort_loop<embree::PrimRefMB*,long,__gnu_cxx::__ops::_Iter_less_iter>
            (pPVar6,pPVar1,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
  std::__final_insertion_sort<embree::PrimRefMB*,__gnu_cxx::__ops::_Iter_less_iter>(pPVar6,pPVar1);
  return;
}

Assistant:

__forceinline Ty begin() const {
        return _begin;
      }